

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

void doctest::detail::logAssertThrowsAs
               (bool threw,bool threw_as,char *as,char *expr,Enum assert_type,char *file,int line)

{
  Code code;
  char *pcVar1;
  undefined7 in_register_00000031;
  Color *this;
  Color col;
  String local_c58;
  String local_c50;
  String local_c48;
  String local_c40;
  char msg [1024];
  char info1 [1024];
  char loc [1024];
  
  pcVar1 = fileForOutput(file);
  snprintf(loc,0x400,"%s(%d)",pcVar1,(ulong)(uint)line);
  if ((int)CONCAT71(in_register_00000031,threw_as) == 0) {
    pcVar1 = "(didn\'t throw at all)";
    if (threw) {
      pcVar1 = "(threw something else)";
    }
    snprintf(msg,0x400," FAILED! %s\n",pcVar1);
  }
  else {
    builtin_strncpy(msg," PASSED!\n",10);
  }
  pcVar1 = getAssertString(assert_type);
  this = (Color *)info1;
  snprintf((char *)this,0x400,"  %s( %s, %s )\n\n",pcVar1,expr,as);
  if (loc[0] != '\0') {
    Color::use(this,LightGrey);
    printf("%s",loc);
    this = &col;
    Color::~Color(this);
  }
  if (msg[0] != '\0') {
    code = Red;
    if (threw_as) {
      code = BrightGreen;
    }
    Color::use(this,code);
    printf("%s",msg);
    this = &col;
    Color::~Color(this);
  }
  if (info1[0] != '\0') {
    Color::use(this,Cyan);
    printf("%s",info1);
    Color::~Color(&col);
  }
  String::String(&local_c48,loc);
  String::String(&local_c50,msg);
  String::operator+(&local_c40,&local_c48);
  String::String(&local_c58,info1);
  String::operator+((String *)&col,&local_c40);
  free(_col);
  free(local_c58.m_str);
  free(local_c40.m_str);
  free(local_c50.m_str);
  free(local_c48.m_str);
  return;
}

Assistant:

void logAssertThrowsAs(bool threw, bool threw_as, const char* as, const char* expr,
                           assertType::Enum assert_type, const char* file, int line) {
        char loc[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(loc, DOCTEST_COUNTOF(loc), "%s(%d)", fileForOutput(file), line);

        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        if(threw_as)
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " PASSED!\n");
        else
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " FAILED! %s\n",
                             (threw ? "(threw something else)" : "(didn't throw at all)"));

        char info1[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(info1, DOCTEST_COUNTOF(info1), "  %s( %s, %s )\n\n",
                         getAssertString(assert_type), expr, as);

        DOCTEST_PRINTF_COLORED(loc, Color::LightGrey);
        DOCTEST_PRINTF_COLORED(msg, threw_as ? Color::BrightGreen : Color::Red);
        DOCTEST_PRINTF_COLORED(info1, Color::Cyan);

        printToDebugConsole(String(loc) + msg + info1);
    }